

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmci.c
# Opt level: O2

int Bmc_BmciPart_rec(Gia_Man_t *pNew,Vec_Int_t *vSatMap,int iIdNew,Gia_Man_t *pPart,
                    Vec_Int_t *vPartMap,Vec_Int_t *vCopies)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint Lit;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  pGVar4 = Gia_ManObj(pNew,iIdNew);
  iVar1 = Vec_IntEntry(vCopies,iIdNew);
  if (iVar1 != 0) {
    iVar1 = Vec_IntEntry(vCopies,iIdNew);
    return iVar1;
  }
  iVar1 = Vec_IntEntry(vSatMap,iIdNew);
  if ((iVar1 < 0) && (uVar3 = (uint)*(undefined8 *)pGVar4, (~uVar3 & 0x9fffffff) != 0)) {
    if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmci.c"
                    ,0x83,
                    "int Bmc_BmciPart_rec(Gia_Man_t *, Vec_Int_t *, int, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar1 = Bmc_BmciPart_rec(pNew,vSatMap,iIdNew - (uVar3 & 0x1fffffff),pPart,vPartMap,vCopies);
    iVar2 = Bmc_BmciPart_rec(pNew,vSatMap,iIdNew - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff),pPart,
                             vPartMap,vCopies);
    uVar3 = Abc_LitNotCond(iVar1,*(uint *)pGVar4 >> 0x1d & 1);
    Lit = Abc_LitNotCond(iVar2,(uint)((ulong)*(undefined8 *)pGVar4 >> 0x3d) & 1);
    Vec_IntPush(vPartMap,iIdNew);
    pGVar4 = Gia_ManAppendObj(pPart);
    iVar1 = Abc_Lit2Var(uVar3);
    if (pPart->nObjs <= iVar1) {
      __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x27a,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
    }
    iVar1 = Abc_Lit2Var(Lit);
    if (pPart->nObjs <= iVar1) {
      __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x27b,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
    }
    if (pPart->fGiaSimple == 0) {
      iVar1 = Abc_Lit2Var(uVar3);
      iVar2 = Abc_Lit2Var(Lit);
      if (iVar1 == iVar2) {
        __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x27c,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
    }
    iVar1 = Gia_ObjId(pPart,pGVar4);
    iVar2 = Abc_Lit2Var(uVar3);
    uVar7 = (ulong)(iVar1 - iVar2 & 0x1fffffff);
    if (uVar3 < Lit) {
      *(ulong *)pGVar4 =
           (ulong)((uVar3 & 1) << 0x1d) | *(ulong *)pGVar4 & 0xffffffffc0000000 | uVar7;
      iVar1 = Gia_ObjId(pPart,pGVar4);
      iVar2 = Abc_Lit2Var(Lit);
      uVar8 = (ulong)(iVar1 - iVar2 & 0x1fffffff) << 0x20;
      uVar7 = (ulong)(Lit & 1) << 0x3d | *(ulong *)pGVar4 & 0xc0000000ffffffff;
    }
    else {
      *(ulong *)pGVar4 =
           (ulong)(uVar3 & 1) << 0x3d | *(ulong *)pGVar4 & 0xc0000000ffffffff | uVar7 << 0x20;
      iVar1 = Gia_ObjId(pPart,pGVar4);
      iVar2 = Abc_Lit2Var(Lit);
      uVar8 = (ulong)(iVar1 - iVar2 & 0x1fffffff);
      uVar7 = (ulong)((Lit & 1) << 0x1d) | *(ulong *)pGVar4 & 0xffffffffc0000000;
    }
    *(ulong *)pGVar4 = uVar7 | uVar8;
    if (pPart->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(pPart,pGVar4 + -((uVar7 | uVar8) & 0x1fffffff),pGVar4);
      Gia_ObjAddFanout(pPart,pGVar4 + -((ulong)*(uint *)&pGVar4->field_0x4 & 0x1fffffff),pGVar4);
    }
    if (pPart->fSweeper != 0) {
      uVar8 = *(ulong *)pGVar4 & 0x1fffffff;
      uVar7 = *(ulong *)pGVar4 >> 0x20 & 0x1fffffff;
      uVar5 = 0x4000000000000000;
      uVar6 = 0x4000000000000000;
      if (((uint)*(ulong *)(pGVar4 + -uVar8) >> 0x1e & 1) == 0) {
        uVar6 = 0x40000000;
      }
      *(ulong *)(pGVar4 + -uVar8) = uVar6 | *(ulong *)(pGVar4 + -uVar8);
      uVar6 = *(ulong *)(pGVar4 + -uVar7);
      if (((uint)uVar6 >> 0x1e & 1) == 0) {
        uVar5 = 0x40000000;
      }
      *(ulong *)(pGVar4 + -uVar7) = uVar5 | uVar6;
      uVar7 = *(ulong *)pGVar4;
      *(ulong *)pGVar4 =
           uVar7 & 0x7fffffffffffffff |
           (ulong)(((uint)(uVar7 >> 0x3d) ^ (uint)(uVar6 >> 0x3f)) &
                  ((uint)((ulong)*(undefined8 *)(pGVar4 + -uVar8) >> 0x3f) ^
                  (uint)(uVar7 >> 0x1d) & 7)) << 0x3f;
    }
    iVar1 = Gia_ObjId(pPart,pGVar4);
    iVar1 = iVar1 * 2;
  }
  else {
    Vec_IntPush(vPartMap,iIdNew);
    iVar1 = Gia_ManAppendCi(pPart);
  }
  Vec_IntWriteEntry(vCopies,iIdNew,iVar1);
  return iVar1;
}

Assistant:

int Bmc_BmciPart_rec( Gia_Man_t * pNew, Vec_Int_t * vSatMap, int iIdNew, Gia_Man_t * pPart, Vec_Int_t * vPartMap, Vec_Int_t * vCopies )
{
    Gia_Obj_t * pObj = Gia_ManObj( pNew, iIdNew ); 
    int iLitPart0, iLitPart1, iRes;
    if ( Vec_IntEntry(vCopies, iIdNew) )
        return Vec_IntEntry(vCopies, iIdNew);
    if ( Vec_IntEntry(vSatMap, iIdNew) >= 0 || Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vPartMap, iIdNew );
        iRes = Gia_ManAppendCi(pPart);
        Vec_IntWriteEntry( vCopies, iIdNew, iRes );
        return iRes;
    }
    assert( Gia_ObjIsAnd(pObj) );
    iLitPart0 = Bmc_BmciPart_rec( pNew, vSatMap, Gia_ObjFaninId0(pObj, iIdNew), pPart, vPartMap, vCopies );
    iLitPart1 = Bmc_BmciPart_rec( pNew, vSatMap, Gia_ObjFaninId1(pObj, iIdNew), pPart, vPartMap, vCopies );
    iLitPart0 = Abc_LitNotCond( iLitPart0, Gia_ObjFaninC0(pObj) );
    iLitPart1 = Abc_LitNotCond( iLitPart1, Gia_ObjFaninC1(pObj) );
    Vec_IntPush( vPartMap, iIdNew );
    iRes = Gia_ManAppendAnd( pPart, iLitPart0, iLitPart1 );
    Vec_IntWriteEntry( vCopies, iIdNew, iRes );
    return iRes;
}